

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_object_physic::update_write(cse_alife_object_physic *this,xr_packet *packet)

{
  float fVar1;
  byte local_19;
  uint8_t num_items;
  xr_packet *packet_local;
  cse_alife_object_physic *this_local;
  
  cse_ph_skeleton::update_write(&this->super_cse_ph_skeleton,packet);
  if (0x79 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    if (0x80 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_version) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                    ,0x282,
                    "virtual void xray_re::cse_alife_object_physic::update_write(xr_packet &)");
    }
    if (this->m_num_items == '\0') {
      (*packet->_vptr_xr_packet[10])(packet,0);
    }
    else {
      local_19 = this->m_num_items & 0x1f;
      if (((this->m_state).enabled & 1U) != 0) {
        local_19 = local_19 | 0x20;
      }
      fVar1 = _vector3<float>::square_magnitude(&(this->m_state).angular_vel);
      if (fVar1 < 1e-07) {
        local_19 = local_19 | 0x40;
      }
      fVar1 = _vector3<float>::square_magnitude(&(this->m_state).linear_vel);
      if (fVar1 < 1e-07) {
        local_19 = local_19 | 0x80;
      }
      (*packet->_vptr_xr_packet[10])(packet,(ulong)local_19);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).force);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).torque);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).position);
      (*packet->_vptr_xr_packet[0xd])((this->m_state).field_6.max_velocity);
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 4));
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 8));
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 0xc));
      if ((local_19 & 0x40) == 0) {
        (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).angular_vel);
      }
      if ((local_19 & 0x80) == 0) {
        (*packet->_vptr_xr_packet[0xf])(packet,&this->m_state);
      }
      (*packet->_vptr_xr_packet[0xc])(packet,1);
    }
  }
  return;
}

Assistant:

void cse_alife_object_physic::update_write(xr_packet& packet)
{
	cse_ph_skeleton::update_write(packet);
	if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_COP);
		if (m_num_items) {
			uint8_t num_items = uint8_t(m_num_items & 0x1f);
			if (m_state.enabled)
				num_items |= 0x20;
			if (m_state.angular_vel.square_magnitude() < 1e-7f)
				num_items |= 0x40;
			if (m_state.linear_vel.square_magnitude() < 1e-7f)
				num_items |= 0x80;
			packet.w_u8(num_items);
			packet.w_vec3(m_state.force);
			packet.w_vec3(m_state.torque);
			packet.w_vec3(m_state.position);
			packet.w_float(m_state.quaternion.x);
			packet.w_float(m_state.quaternion.y);
			packet.w_float(m_state.quaternion.z);
			packet.w_float(m_state.quaternion.w);
			if ((num_items & 0x40) == 0)
				packet.w_vec3(m_state.angular_vel);
			if ((num_items & 0x80) == 0)
				packet.w_vec3(m_state.linear_vel);
			packet.w_bool(true);
		} else {
			packet.w_u8(0);
		}
	}
}